

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

char * fmt::v7::detail::
       parse_arg_id<char,fmt::v7::detail::id_adapter<fmt::v7::detail::format_handler<fmt::v7::detail::buffer_appender<char>,char,fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>&,char>&>
                 (char *begin,char *end,
                 id_adapter<fmt::v7::detail::format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_&,_char>
                 *handler)

{
  byte bVar1;
  int id;
  byte *pbVar2;
  byte *pbVar3;
  type tVar4;
  byte *pbVar5;
  basic_string_view<char> id_00;
  byte *local_20;
  
  local_20 = (byte *)begin;
  if (begin == end) {
    assert_fail("/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/external/fmt/include/fmt/format.h"
                ,0xa8e,"");
  }
  bVar1 = *begin;
  pbVar5 = (byte *)begin;
  if ((bVar1 == 0x7d) || (bVar1 == 0x3a)) {
    id_adapter<fmt::v7::detail::format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_&,_char>
    ::operator()(handler);
  }
  else if ((byte)(bVar1 - 0x30) < 10) {
    if (bVar1 == 0x30) {
      local_20 = (byte *)(begin + 1);
      id = 0;
    }
    else {
      id = parse_nonnegative_int<char,fmt::v7::detail::id_adapter<fmt::v7::detail::format_handler<fmt::v7::detail::buffer_appender<char>,char,fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>&,char>&>
                     ((char **)&local_20,end,handler);
    }
    if ((local_20 == (byte *)end) || ((*local_20 != 0x3a && (*local_20 != 0x7d)))) {
      id_adapter<fmt::v7::detail::format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_&,_char>
      ::on_error(handler,"invalid format string");
      pbVar5 = local_20;
    }
    else {
      id_adapter<fmt::v7::detail::format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_&,_char>
      ::operator()(handler,id);
      pbVar5 = local_20;
    }
  }
  else if ((bVar1 == 0x5f) || ((byte)((bVar1 & 0xdf) + 0xbf) < 0x1a)) {
    pbVar3 = (byte *)(begin + 1);
    do {
      pbVar2 = pbVar3;
      pbVar5 = (byte *)end;
      if (pbVar2 == (byte *)end) break;
      bVar1 = *pbVar2;
      pbVar3 = pbVar2 + 1;
    } while ((((byte)(bVar1 - 0x30) < 10) || (bVar1 == 0x5f)) ||
            (pbVar5 = pbVar2, (byte)((bVar1 & 0xdf) + 0xbf) < 0x1a));
    tVar4 = to_unsigned<long>((long)pbVar5 - (long)begin);
    id_00.size_ = tVar4;
    id_00.data_ = begin;
    id_adapter<fmt::v7::detail::format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_&,_char>
    ::operator()(handler,id_00);
  }
  else {
    id_adapter<fmt::v7::detail::format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_&,_char>
    ::on_error(handler,"invalid format string");
  }
  return (char *)pbVar5;
}

Assistant:

FMT_CONSTEXPR const Char* parse_arg_id(const Char* begin, const Char* end,
                                       IDHandler&& handler) {
  FMT_ASSERT(begin != end, "");
  Char c = *begin;
  if (c == '}' || c == ':') {
    handler();
    return begin;
  }
  if (c >= '0' && c <= '9') {
    int index = 0;
    if (c != '0')
      index = parse_nonnegative_int(begin, end, handler);
    else
      ++begin;
    if (begin == end || (*begin != '}' && *begin != ':'))
      handler.on_error("invalid format string");
    else
      handler(index);
    return begin;
  }
  if (!is_name_start(c)) {
    handler.on_error("invalid format string");
    return begin;
  }
  auto it = begin;
  do {
    ++it;
  } while (it != end && (is_name_start(c = *it) || ('0' <= c && c <= '9')));
  handler(basic_string_view<Char>(begin, to_unsigned(it - begin)));
  return it;
}